

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

ConvexH * ConvexDecomposition::test_btbq(void)

{
  float3 *pfVar1;
  Plane *pPVar2;
  HalfEdge *pHVar3;
  ConvexH *this;
  char *__function;
  
  this = (ConvexH *)::operator_new(0x30);
  ConvexH::ConvexH(this,4,8,2);
  if (0 < (this->vertices).count) {
    pfVar1 = (this->vertices).element;
    pfVar1->x = 0.0;
    pfVar1->y = 0.0;
    pfVar1->z = 0.0;
    if (1 < (this->vertices).count) {
      pfVar1[1].x = 1.0;
      pfVar1[1].y = 0.0;
      pfVar1[1].z = 0.0;
      if (2 < (this->vertices).count) {
        pfVar1[2].x = 1.0;
        pfVar1[2].y = 1.0;
        pfVar1[2].z = 0.0;
        if (3 < (this->vertices).count) {
          pfVar1[3].x = 0.0;
          pfVar1[3].y = 1.0;
          pfVar1[3].z = 0.0;
          if (0 < (this->facets).count) {
            pPVar2 = (this->facets).element;
            (pPVar2->normal).x = 0.0;
            (pPVar2->normal).y = 0.0;
            *(undefined8 *)&(pPVar2->normal).z = 0x3f800000;
            if (1 < (this->facets).count) {
              pPVar2[1].normal.x = 0.0;
              pPVar2[1].normal.y = 0.0;
              *(undefined8 *)&pPVar2[1].normal.z = 0xbf800000;
              if (((((0 < (this->edges).count) &&
                    (pHVar3 = (this->edges).element, pHVar3->ea = 7, pHVar3->v = '\0',
                    pHVar3->p = '\0', 1 < (this->edges).count)) &&
                   (pHVar3 = (this->edges).element, pHVar3[1].ea = 6, pHVar3[1].v = '\x01',
                   pHVar3[1].p = '\0', 2 < (this->edges).count)) &&
                  ((pHVar3 = (this->edges).element, pHVar3[2].ea = 5, pHVar3[2].v = '\x02',
                   pHVar3[2].p = '\0', 3 < (this->edges).count &&
                   (pHVar3 = (this->edges).element, pHVar3[3].ea = 4, pHVar3[3].v = '\x03',
                   pHVar3[3].p = '\0', 4 < (this->edges).count)))) &&
                 ((pHVar3 = (this->edges).element, pHVar3[4].ea = 3, pHVar3[4].v = '\0',
                  pHVar3[4].p = '\x01', 5 < (this->edges).count &&
                  ((pHVar3 = (this->edges).element, pHVar3[5].ea = 2, pHVar3[5].v = '\x03',
                   pHVar3[5].p = '\x01', 6 < (this->edges).count &&
                   (pHVar3 = (this->edges).element, pHVar3[6].ea = 1, pHVar3[6].v = '\x02',
                   pHVar3[6].p = '\x01', 7 < (this->edges).count)))))) {
                pHVar3 = (this->edges).element;
                pHVar3[7].ea = 0;
                pHVar3[7].v = '\x01';
                pHVar3[7].p = '\x01';
                AssertIntact(this);
                return this;
              }
              __function = 
              "Type &ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
              ;
              goto LAB_0092f2bb;
            }
          }
          __function = 
          "Type &ConvexDecomposition::Array<ConvexDecomposition::Plane>::operator[](int) [Type = ConvexDecomposition::Plane]"
          ;
          goto LAB_0092f2bb;
        }
      }
    }
  }
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
  ;
LAB_0092f2bb:
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,__function);
}

Assistant:

ConvexH *test_btbq() {
	ConvexH *convex = new ConvexH(4,8,2);
	convex->vertices[0] = REAL3(0,0,0);
	convex->vertices[1] = REAL3(1,0,0);
	convex->vertices[2] = REAL3(1,1,0);
	convex->vertices[3] = REAL3(0,1,0);
	convex->facets[0] = Plane(REAL3(0,0,1),0);
	convex->facets[1] = Plane(REAL3(0,0,-1),0);
	convex->edges[0]  = HalfEdge(7,0,0);
	convex->edges[1]  = HalfEdge(6,1,0);
	convex->edges[2]  = HalfEdge(5,2,0);
	convex->edges[3]  = HalfEdge(4,3,0);

	convex->edges[4]  = HalfEdge(3,0,1);
	convex->edges[5]  = HalfEdge(2,3,1);
	convex->edges[6]  = HalfEdge(1,2,1);
	convex->edges[7]  = HalfEdge(0,1,1);
	AssertIntact(*convex);
	return convex;
}